

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplaceRealloc<slang::ast::Scope_const&,slang::syntax::ParameterDeclarationSyntax_const&,slang::syntax::DeclaratorSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,pointer pos,
          Scope *args,ParameterDeclarationSyntax *args_1,DeclaratorSyntax *args_2,bool *args_3,
          bool *args_4,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *args_5)

{
  ParameterDecl *this_00;
  ulong uVar1;
  pointer p;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar2;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 aVar3;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar4;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar5;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar6;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar7;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar8;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar9;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar10;
  pointer pPVar11;
  long lVar12;
  ulong uVar13;
  size_type sVar14;
  long lVar15;
  
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar13 = this->len + 1;
  uVar1 = this->cap;
  if (uVar13 < uVar1 * 2) {
    uVar13 = uVar1 * 2;
  }
  if (0x1ffffffffffffff - uVar1 < uVar1) {
    uVar13 = 0x1ffffffffffffff;
  }
  lVar15 = (long)pos - (long)this->data_;
  paVar9 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)operator_new(uVar13 << 6);
  this_00 = (ParameterDecl *)((long)paVar9 + lVar15);
  ast::DefinitionSymbol::ParameterDecl::ParameterDecl
            (this_00,args,args_1,args_2,*args_3,*args_4,*args_5);
  p = this->data_;
  sVar14 = this->len;
  lVar12 = (long)p + (sVar14 * 0x40 - (long)pos);
  pPVar11 = p;
  paVar10 = paVar9;
  if (lVar12 == 0) {
    if (sVar14 != 0) {
      do {
        aVar2 = pPVar11->field_0;
        aVar3 = pPVar11->field_1;
        aVar4 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar11->name)._M_len;
        aVar5 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar11->name)._M_str;
        aVar6 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar11->location;
        aVar7 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar11->attributes)._M_ptr;
        aVar8 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar11->isTypeParam;
        paVar10[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                     (pPVar11->attributes)._M_extent._M_extent_value;
        paVar10[7] = aVar8;
        paVar10[4] = aVar6;
        paVar10[5] = aVar7;
        paVar10[2] = aVar4;
        paVar10[3] = aVar5;
        *paVar10 = aVar2;
        *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar10 + 1) = aVar3;
        pPVar11 = pPVar11 + 1;
        paVar10 = paVar10 + 8;
      } while (pPVar11 != pos);
    }
  }
  else {
    for (; pPVar11 != pos; pPVar11 = pPVar11 + 1) {
      aVar2 = pPVar11->field_0;
      aVar3 = pPVar11->field_1;
      aVar4 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar11->name)._M_len;
      aVar5 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar11->name)._M_str;
      aVar6 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar11->location;
      aVar7 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar11->attributes)._M_ptr;
      aVar8 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar11->isTypeParam;
      paVar10[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                   (pPVar11->attributes)._M_extent._M_extent_value;
      paVar10[7] = aVar8;
      paVar10[4] = aVar6;
      paVar10[5] = aVar7;
      paVar10[2] = aVar4;
      paVar10[3] = aVar5;
      *paVar10 = aVar2;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar10 + 1) = aVar3;
      paVar10 = paVar10 + 8;
    }
    memcpy((void *)((long)paVar9 + lVar15 + 0x40),pos,(lVar12 - 0x40U & 0xffffffffffffffc0) + 0x40);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar14 = this->len;
  }
  this->len = sVar14 + 1;
  this->cap = uVar13;
  this->data_ = (pointer)paVar9;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}